

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefines.cpp
# Opt level: O1

bool soplex::msginconsistent(char *name,char *file,int line)

{
  size_t sVar1;
  ostream *poVar2;
  
  if (file == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x3bf670);
  }
  else {
    sVar1 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,file,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Inconsistency detected in ",0x1a);
  if (name == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,name,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool msginconsistent(const char* name, const char* file, int line)
{
   assert(name != nullptr);
   assert(file != nullptr);
   assert(line >= 0);

   SPX_MSG_ERROR(std::cerr << file << "(" << line << ") "
                 << "Inconsistency detected in " << name << std::endl;)

   return 0;
}